

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::ensureComboBox(QInputDialogPrivate *this)

{
  QWidget *parent;
  QWidget *widget;
  QWidgetPrivate *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_40 [16];
  undefined8 uStack_30;
  QWidgetData *local_20;
  
  local_20 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (this->comboBox == (QComboBox *)0x0) {
    parent = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    widget = (QWidget *)operator_new(0x28);
    QComboBox::QComboBox((QComboBox *)widget,parent);
    this->comboBox = (QComboBox *)widget;
    pQVar1 = qt_widget_private(widget);
    pQVar1->field_0x253 = pQVar1->field_0x253 | 4;
    QWidget::hide(&this->comboBox->super_QWidget);
    local_40._8_8_ = textChanged;
    uStack_30._0_1_ = (QPaintDevice)0x0;
    uStack_30._1_7_ = 0;
    QObjectPrivate::
    connect<void(QComboBox::*)(QString_const&),void(QInputDialogPrivate::*)(QString_const&)>
              ((Object *)&stack0xffffffffffffffd8,(offset_in_QComboBox_to_subr)this->comboBox,
               (Object *)QComboBox::editTextChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd8);
    local_40._8_8_ = textChanged;
    uStack_30._0_1_ = (QPaintDevice)0x0;
    uStack_30._1_7_ = 0;
    QObjectPrivate::
    connect<void(QComboBox::*)(QString_const&),void(QInputDialogPrivate::*)(QString_const&)>
              ((Object *)local_40,(offset_in_QComboBox_to_subr)this->comboBox,
               (Object *)QComboBox::currentTextChanged,0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_40);
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::ensureComboBox()
{
    Q_Q(QInputDialog);
    if (!comboBox) {
        comboBox = new QComboBox(q);
#ifndef QT_NO_IM
        qt_widget_private(comboBox)->inheritsInputMethodHints = 1;
#endif
        comboBox->hide();
        QObjectPrivate::connect(comboBox, &QComboBox::editTextChanged,
                                this, &QInputDialogPrivate::textChanged);
        QObjectPrivate::connect(comboBox, &QComboBox::currentTextChanged,
                                this, &QInputDialogPrivate::textChanged);
    }
}